

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O0

void __thiscall LSM_tree::put(LSM_tree *this,uint64_t key,string *s,bool d)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  Level *this_00;
  reference ppLVar4;
  Level *local_30;
  Level *level;
  int size;
  bool d_local;
  string *s_local;
  uint64_t key_local;
  LSM_tree *this_local;
  
  level._7_1_ = d;
  _size = s;
  s_local = (string *)key;
  key_local = (uint64_t)this;
  level._0_4_ = Skiplist::cap(&this->memtable);
  lVar2 = (long)(int)level;
  lVar3 = std::__cxx11::string::size();
  if (0x200000 < lVar2 + lVar3 + 9U) {
    bVar1 = std::vector<Level_*,_std::allocator<Level_*>_>::empty(&this->disk);
    if (bVar1) {
      this_00 = (Level *)operator_new(0x28);
      Level::Level(this_00,0);
      local_30 = this_00;
      std::vector<Level_*,_std::allocator<Level_*>_>::push_back(&this->disk,&local_30);
    }
    else {
      ppLVar4 = std::vector<Level_*,_std::allocator<Level_*>_>::operator[](&this->disk,0);
      local_30 = *ppLVar4;
    }
    this->timer = this->timer + 1;
    Level::flush_to_file(local_30,&this->memtable,this->timer);
    compaction(this);
  }
  Skiplist::put(&this->memtable,(uint64_t)s_local,_size,(bool)(level._7_1_ & 1));
  return;
}

Assistant:

void LSM_tree::put(uint64_t key, const std::string &s, bool d) {
    int size = memtable.cap();

    //---------------------------如果加上这个会超size 就先flush_to_file----------------//
    if (size + s.size() + 1 + sizeof(uint64_t) > MAX_SIZE) {

        Level *level;
        if (disk.empty()) {

            level = new Level(0);                                                                                          //reset里析构level
            disk.push_back(level);
        } else
            level = disk[0];


        //把memtable里的东西 写道文件 并且把 索引存到sstable 由level统一管理
        //注意timer 因为这里都是最新的 timer统一

        timer++;
        level->flush_to_file(memtable, timer);//已经把memtable清空

        compaction();
      // memtable.clear();
        //memtable.my_clear();
    }

    memtable.put(key, s, d);
}